

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

optional<long> __thiscall
anon_unknown.dwarf_221797::AddressDescriptor::ScriptSize(AddressDescriptor *this)

{
  uint uVar1;
  undefined8 extraout_RDX;
  long in_FS_OFFSET;
  optional<long> oVar2;
  prevector<28U,_unsigned_char,_unsigned_int,_int> pStack_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  GetScriptForDestination((CScript *)&pStack_38,&this->m_destination);
  uVar1 = pStack_38._size - 0x1d;
  if (pStack_38._size < 0x1d) {
    uVar1 = pStack_38._size;
  }
  oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload._M_value._4_4_ = 0;
  oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload._M_value._0_4_ = uVar1;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&pStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._9_7_
         = (undefined7)((ulong)extraout_RDX >> 8);
    oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_engaged = true;
    return (optional<long>)
           oVar2.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<int64_t> ScriptSize() const override { return GetScriptForDestination(m_destination).size(); }